

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad_gl.c
# Opt level: O2

int glad_gl_has_extension(int version,char *exts,uint num_exts_i,char **exts_i,char *ext)

{
  ulong uVar1;
  int iVar2;
  byte *pbVar3;
  size_t sVar4;
  byte *pbVar5;
  ulong uVar6;
  uint uVar7;
  
  if (version < 30000) {
    uVar7 = 0;
    if (ext != (char *)0x0 && exts != (char *)0x0) {
      do {
        pbVar3 = (byte *)strstr(exts,ext);
        if (pbVar3 == (byte *)0x0) {
          return 0;
        }
        sVar4 = strlen(ext);
        pbVar5 = pbVar3 + sVar4;
      } while (((pbVar3 != (byte *)exts) && (exts = (char *)pbVar5, pbVar3[-1] != 0x20)) ||
              (exts = (char *)pbVar5, (*pbVar5 & 0xdf) != 0));
      uVar7 = 1;
    }
  }
  else {
    uVar1 = 0;
    do {
      uVar6 = uVar1;
      if (num_exts_i == uVar6) break;
      iVar2 = strcmp(exts_i[uVar6],ext);
      uVar1 = uVar6 + 1;
    } while (iVar2 != 0);
    uVar7 = (uint)(uVar6 < num_exts_i);
  }
  return uVar7;
}

Assistant:

static int glad_gl_has_extension(int version, const char *exts, unsigned int num_exts_i, char **exts_i, const char *ext) {
    if(GLAD_VERSION_MAJOR(version) < 3 || !GLAD_GL_IS_SOME_NEW_VERSION) {
        const char *extensions;
        const char *loc;
        const char *terminator;
        extensions = exts;
        if(extensions == NULL || ext == NULL) {
            return 0;
        }
        while(1) {
            loc = strstr(extensions, ext);
            if(loc == NULL) {
                return 0;
            }
            terminator = loc + strlen(ext);
            if((loc == extensions || *(loc - 1) == ' ') &&
                (*terminator == ' ' || *terminator == '\0')) {
                return 1;
            }
            extensions = terminator;
        }
    } else {
        unsigned int index;
        for(index = 0; index < num_exts_i; index++) {
            const char *e = exts_i[index];
            if(strcmp(e, ext) == 0) {
                return 1;
            }
        }
    }
    return 0;
}